

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator
          (ImmutableExtensionLiteGenerator *this)

{
  ImmutableExtensionLiteGenerator *this_local;
  
  ~ImmutableExtensionLiteGenerator(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator() {}